

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::FullUncertaintyWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *__x;
  _Rb_tree_header *p_Var1;
  int *__k;
  pointer pmVar2;
  int *piVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  code *pcVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  undefined4 in_register_0000000c;
  long *plVar10;
  int *piVar11;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x;
  pair<const_outkey2,_OutLosses> x_1;
  lossval lv;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &items._M_t._M_impl.super__Rb_tree_header._M_header;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = &this->periodstoweighting_;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&unusedperiodstoweighting._M_t,&__x->_M_t);
  pmVar2 = (this->out_loss_->
           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  plVar10 = (long *)((long)&x.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
  p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var6 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var6 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    x.second.max_out_loss = *(OASIS_FLOAT *)&p_Var6[1]._M_left;
    x.first.summary_id = p_Var6[1]._M_color;
    x.first.period_no = *(int *)&p_Var6[1].field_0x4;
    x._8_8_ = p_Var6[1]._M_parent;
    pcVar7 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      pcVar7 = *(code **)(*plVar10 + -1 + GetOutLoss);
    }
    lv.value = (OASIS_FLOAT)(*pcVar7)(plVar10);
    iVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::find(&__x->_M_t,&x.first.period_no);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      lv.period_weighting = (double)iVar4._M_node[1]._M_parent;
      lv.period_no = x.first.period_no;
      pmVar5 = std::
               map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
               ::operator[](&items,(key_type *)&x);
      std::vector<lossval,_std::allocator<lossval>_>::push_back(pmVar5,&lv);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::erase(&unusedperiodstoweighting._M_t,&x.first.period_no);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,&items,1.0,eptype,eptype_tvar,in_stack_00000008,&unusedperiodstoweighting,
             1);
  if ((this->ordFlag_ == false) &&
     ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    plVar10 = (long *)((long)&x_1.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
    __k = &x_1.first.period_no;
    for (p_Var9 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&lv,
                 (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)(p_Var9 + 1));
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
      ::clear(&items._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::operator=(&unusedperiodstoweighting._M_t,&__x->_M_t);
      pmVar2 = (this->out_loss_->
               super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (p_Var8 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var8 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        x_1.second.max_out_loss = *(OASIS_FLOAT *)&p_Var8[1]._M_left;
        x_1.first.summary_id = p_Var8[1]._M_color;
        x_1.first.period_no = *(int *)&p_Var8[1].field_0x4;
        x_1.first.sidx = *(int *)&p_Var8[1]._M_parent;
        x_1.second.agg_out_loss = *(OASIS_FLOAT *)((long)&p_Var8[1]._M_parent + 4);
        piVar3 = (int *)CONCAT44(lv._20_4_,lv.value);
        for (piVar11 = (int *)lv.period_weighting; piVar11 != piVar3; piVar11 = piVar11 + 1) {
          if (x_1.first.sidx == *piVar11) {
            pcVar7 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              pcVar7 = *(code **)(*plVar10 + -1 + GetOutLoss);
            }
            x.second.max_out_loss = (OASIS_FLOAT)(*pcVar7)(plVar10);
            iVar4 = std::
                    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    ::find(&__x->_M_t,__k);
            if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
              x._8_8_ = iVar4._M_node[1]._M_parent;
              x.first.summary_id = x_1.first.period_no;
              pmVar5 = std::
                       map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                       ::operator[](&items,(key_type *)&x_1);
              std::vector<lossval,_std::allocator<lossval>_>::push_back(pmVar5,(value_type *)&x);
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::erase(&unusedperiodstoweighting._M_t,__k);
          }
        }
      }
      WriteExceedanceProbabilityTable
                (this,fileIDs,&items,1.0,eptype,lv.period_no,in_stack_00000008,
                 &unusedperiodstoweighting,1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&lv.period_weighting);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&unusedperiodstoweighting._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~_Rb_tree(&items._M_t);
  return;
}

Assistant:

void aggreports::FullUncertaintyWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  std::map<int, lossvec2> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[SAMPLES]) {
    lossval lv;
    lv.value = (x.second.*GetOutLoss)();
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      lv.period_weighting = iter->second;
      lv.period_no = x.first.period_no;   // for debugging
      items[x.first.summary_id].push_back(lv);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  WriteExceedanceProbabilityTable(fileIDs, items, 1, epcalc, eptype,
				  eptype_tvar, unusedperiodstoweighting);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      unusedperiodstoweighting = periodstoweighting_;
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    lossval lv;
	    lv.value = (x.second.*GetOutLoss)();
	    auto iter = periodstoweighting_.find(x.first.period_no);
	    if (iter != periodstoweighting_.end()) {
	      lv.period_weighting = iter->second;
	      lv.period_no = x.first.period_no;   // for debugging
	      items[x.first.summary_id].push_back(lv);
	    }
	    unusedperiodstoweighting.erase(x.first.period_no);
	  }
	}
      }
      // EPType doubles as ensemble ID for legacy output
      WriteExceedanceProbabilityTable(fileIDs, items, 1, epcalc, ensemble.first,
				      eptype_tvar, unusedperiodstoweighting, 1);
    }
  }

}